

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.h
# Opt level: O0

void emitter_json_kv(emitter_t *emitter,char *json_key,emitter_type_t value_type,void *value)

{
  emitter_t *in_RCX;
  undefined4 in_stack_ffffffffffffffd8;
  emitter_type_t in_stack_ffffffffffffffdc;
  
  emitter_json_key(in_RCX,(char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  emitter_json_value(in_RCX,in_stack_ffffffffffffffdc,(void *)0x25bad9);
  return;
}

Assistant:

static inline void
emitter_json_kv(emitter_t *emitter, const char *json_key,
    emitter_type_t value_type, const void *value) {
	emitter_json_key(emitter, json_key);
	emitter_json_value(emitter, value_type, value);
}